

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_unsigned.cpp
# Opt level: O2

bool sc_dt::operator==(sc_unsigned *u,long v)

{
  int iVar1;
  sc_digit vd [3];
  
  if (-1 < v) {
    from_uint<unsigned_long>(3,vd,v);
    iVar1 = compare_unsigned(u->sgn,u->nbits,u->ndigits,u->digit,(uint)(v != 0),0x40,3,vd,0,0);
    return iVar1 == 0;
  }
  return false;
}

Assistant:

bool
operator==(const sc_unsigned& u, long v)
{
  if (v < 0)
    return false;
  CONVERT_LONG(v);
  if (compare_unsigned(u.sgn, u.nbits, u.ndigits, u.digit,
                       vs, BITS_PER_ULONG, DIGITS_PER_ULONG, vd) != 0)
    return false;
  return true;
}